

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

int bpmnode_compare(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((*b <= *a) && (uVar1 = 1, *a <= *b)) {
    uVar1 = (*(uint *)((long)a + 4) < *(uint *)((long)b + 4)) - 1 | 1;
  }
  return uVar1;
}

Assistant:

static int bpmnode_compare(const void* a, const void* b)
{
  int wa = ((const BPMNode*)a)->weight;
  int wb = ((const BPMNode*)b)->weight;
  if(wa < wb) return -1;
  if(wa > wb) return 1;
  /*make the qsort a stable sort*/
  return ((const BPMNode*)a)->index < ((const BPMNode*)b)->index ? 1 : -1;
}